

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmocka.c
# Opt level: O0

int integer_in_range_display_error
              (unsigned_long value,unsigned_long range_min,unsigned_long range_max)

{
  ulong in_RDX;
  ulong in_RSI;
  ulong in_RDI;
  int local_4;
  
  if ((in_RDI < in_RSI) || (in_RDX < in_RDI)) {
    cm_print_error("%lu is not within the range %lu-%lu\n",in_RDI,in_RSI,in_RDX);
    local_4 = 0;
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int integer_in_range_display_error(
        const LargestIntegralType value, const LargestIntegralType range_min,
        const LargestIntegralType range_max) {
    if (value >= range_min && value <= range_max) {
        return 1;
    }
    cm_print_error(LargestIntegralTypePrintfFormatDecimal
                   " is not within the range "
                   LargestIntegralTypePrintfFormatDecimal "-"
                   LargestIntegralTypePrintfFormatDecimal "\n",
                   value, range_min, range_max);
    return 0;
}